

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O0

void __thiscall
cmIncludeDirectoryCommand::GetIncludes
          (cmIncludeDirectoryCommand *this,string *arg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *incs)

{
  long lVar1;
  ulong uVar2;
  undefined1 local_80 [8];
  string inc;
  undefined1 local_50 [8];
  string inc_1;
  size_type lastPos;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *incs_local;
  string *arg_local;
  cmIncludeDirectoryCommand *this_local;
  
  inc_1.field_2._8_8_ = 0;
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)arg,10);
    if (lVar1 == -1) break;
    if (lVar1 != 0) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)arg);
      NormalizeInclude(this,(string *)local_50);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(incs,(value_type *)local_50);
      }
      std::__cxx11::string::~string((string *)local_50);
    }
    inc_1.field_2._8_8_ = lVar1 + 1;
  }
  std::__cxx11::string::substr((ulong)local_80,(ulong)arg);
  NormalizeInclude(this,(string *)local_80);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(incs,(value_type *)local_80);
  }
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void cmIncludeDirectoryCommand::GetIncludes(const std::string& arg,
                                            std::vector<std::string>& incs)
{
  // break apart any line feed arguments
  std::string::size_type pos = 0;
  std::string::size_type lastPos = 0;
  while ((pos = arg.find('\n', lastPos)) != std::string::npos) {
    if (pos) {
      std::string inc = arg.substr(lastPos, pos);
      this->NormalizeInclude(inc);
      if (!inc.empty()) {
        incs.push_back(inc);
      }
    }
    lastPos = pos + 1;
  }
  std::string inc = arg.substr(lastPos);
  this->NormalizeInclude(inc);
  if (!inc.empty()) {
    incs.push_back(inc);
  }
}